

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

void fwd_txfm2d_c(int16_t *input,int32_t *output,int stride,TXFM_2D_FLIP_CFG *cfg,int32_t *buf,
                 int bd)

{
  int iVar1;
  int32_t iVar2;
  TXFM_2D_FLIP_CFG *in_RCX;
  int in_EDX;
  int32_t *in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int32_t row_buffer [64];
  int32_t *temp_out;
  int32_t *temp_in;
  TxfmFunc txfm_func_row;
  TxfmFunc txfm_func_col;
  int8_t cos_bit_row;
  int8_t cos_bit_col;
  int8_t stage_range_row [12];
  int8_t stage_range_col [12];
  int rect_type;
  int8_t *shift;
  int txfm_size_row;
  int txfm_size_col;
  int r;
  int c;
  int32_t aiStack_188 [64];
  int32_t *local_88;
  int32_t *local_80;
  TxfmFunc local_78;
  TxfmFunc local_70;
  int8_t local_66;
  int8_t local_65;
  int8_t local_64 [12];
  int8_t local_58 [12];
  int local_4c;
  char *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  TXFM_2D_FLIP_CFG *local_20;
  int local_14;
  int32_t *local_10;
  long local_8;
  
  local_38 = tx_size_wide[in_RCX->tx_size];
  local_3c = tx_size_high[in_RCX->tx_size];
  local_48 = in_RCX->shift;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_4c = get_rect_tx_log_ratio(local_38,local_3c);
  av1_gen_fwd_stage_range(local_58,local_64,local_20,local_2c);
  local_65 = local_20->cos_bit_col;
  local_66 = local_20->cos_bit_row;
  local_70 = fwd_txfm_type_to_func(local_20->txfm_type_col);
  local_78 = fwd_txfm_type_to_func(local_20->txfm_type_row);
  local_80 = local_10;
  local_88 = local_10 + local_3c;
  for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
    if (local_20->ud_flip == 0) {
      for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
        local_80[local_34] = (int)*(short *)(local_8 + (long)(local_34 * local_14 + local_30) * 2);
      }
    }
    else {
      for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
        local_80[local_34] =
             (int)*(short *)(local_8 +
                            (long)(((local_3c - local_34) + -1) * local_14 + local_30) * 2);
      }
    }
    (*av1_round_shift_array)(local_80,local_3c,-(int)*local_48);
    (*local_70)(local_80,local_88,local_65,local_58);
    (*av1_round_shift_array)(local_88,local_3c,-(int)local_48[1]);
    if (local_20->lr_flip == 0) {
      for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
        *(int32_t *)(local_28 + (long)(local_34 * local_38 + local_30) * 4) = local_88[local_34];
      }
    }
    else {
      for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
        *(int32_t *)(local_28 + (long)(local_34 * local_38 + (local_38 - local_30) + -1) * 4) =
             local_88[local_34];
      }
    }
  }
  for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
    (*local_78)((int32_t *)(local_28 + (long)(local_34 * local_38) * 4),aiStack_188,local_66,
                local_64);
    (*av1_round_shift_array)(aiStack_188,local_38,-(int)local_48[2]);
    iVar1 = local_4c;
    if (local_4c < 1) {
      iVar1 = -local_4c;
    }
    if (iVar1 == 1) {
      for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
        iVar2 = round_shift((long)aiStack_188[local_30] * 0x16a1,0xc);
        aiStack_188[local_30] = iVar2;
      }
    }
    for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
      local_10[local_30 * local_3c + local_34] = aiStack_188[local_30];
    }
  }
  return;
}

Assistant:

static inline void fwd_txfm2d_c(const int16_t *input, int32_t *output,
                                const int stride, const TXFM_2D_FLIP_CFG *cfg,
                                int32_t *buf, int bd) {
  int c, r;
  // Note when assigning txfm_size_col, we use the txfm_size from the
  // row configuration and vice versa. This is intentionally done to
  // accurately perform rectangular transforms. When the transform is
  // rectangular, the number of columns will be the same as the
  // txfm_size stored in the row cfg struct. It will make no difference
  // for square transforms.
  const int txfm_size_col = tx_size_wide[cfg->tx_size];
  const int txfm_size_row = tx_size_high[cfg->tx_size];
  // Take the shift from the larger dimension in the rectangular case.
  const int8_t *shift = cfg->shift;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);
  int8_t stage_range_col[MAX_TXFM_STAGE_NUM];
  int8_t stage_range_row[MAX_TXFM_STAGE_NUM];
  assert(cfg->stage_num_col <= MAX_TXFM_STAGE_NUM);
  assert(cfg->stage_num_row <= MAX_TXFM_STAGE_NUM);
  av1_gen_fwd_stage_range(stage_range_col, stage_range_row, cfg, bd);

  const int8_t cos_bit_col = cfg->cos_bit_col;
  const int8_t cos_bit_row = cfg->cos_bit_row;
  const TxfmFunc txfm_func_col = fwd_txfm_type_to_func(cfg->txfm_type_col);
  const TxfmFunc txfm_func_row = fwd_txfm_type_to_func(cfg->txfm_type_row);

  // use output buffer as temp buffer
  int32_t *temp_in = output;
  int32_t *temp_out = output + txfm_size_row;

  // Columns
  for (c = 0; c < txfm_size_col; ++c) {
    if (cfg->ud_flip == 0) {
      for (r = 0; r < txfm_size_row; ++r) temp_in[r] = input[r * stride + c];
    } else {
      for (r = 0; r < txfm_size_row; ++r)
        // flip upside down
        temp_in[r] = input[(txfm_size_row - r - 1) * stride + c];
    }
    av1_round_shift_array(temp_in, txfm_size_row, -shift[0]);
    txfm_func_col(temp_in, temp_out, cos_bit_col, stage_range_col);
    av1_round_shift_array(temp_out, txfm_size_row, -shift[1]);
    if (cfg->lr_flip == 0) {
      for (r = 0; r < txfm_size_row; ++r)
        buf[r * txfm_size_col + c] = temp_out[r];
    } else {
      for (r = 0; r < txfm_size_row; ++r)
        // flip from left to right
        buf[r * txfm_size_col + (txfm_size_col - c - 1)] = temp_out[r];
    }
  }

  DECLARE_ALIGNED(16, int32_t, row_buffer[MAX_TX_SIZE]);

  // Rows
  for (r = 0; r < txfm_size_row; ++r) {
    txfm_func_row(buf + r * txfm_size_col, row_buffer, cos_bit_row,
                  stage_range_row);
    av1_round_shift_array(row_buffer, txfm_size_col, -shift[2]);
    if (abs(rect_type) == 1) {
      // Multiply everything by Sqrt2 if the transform is rectangular and the
      // size difference is a factor of 2.
      for (c = 0; c < txfm_size_col; ++c) {
        row_buffer[c] =
            round_shift((int64_t)row_buffer[c] * NewSqrt2, NewSqrt2Bits);
      }
    }
    for (c = 0; c < txfm_size_col; ++c) {
      output[c * txfm_size_row + r] = row_buffer[c];
    }
  }
}